

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Execute<int,duckdb::hugeint_t,duckdb::ArgMinMaxState<int,duckdb::hugeint_t>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<int,_duckdb::hugeint_t> *state,int x_data,hugeint_t y_data,
          AggregateBinaryInput *binary)

{
  uint64_t uVar1;
  undefined4 in_register_00000014;
  long lVar2;
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar3;
  
  lVar2 = y_data.upper;
  uVar1 = y_data.lower;
  if ((**(long **)(lVar2 + 0x10) != 0) &&
     ((*(ulong *)(**(long **)(lVar2 + 0x10) + (*(ulong *)(lVar2 + 0x20) >> 6) * 8) >>
       (*(ulong *)(lVar2 + 0x20) & 0x3f) & 1) == 0)) {
    return;
  }
  if (((long)uVar1 <= (long)*(uint64_t *)(this + 0x10)) &&
     (CONCAT44(in_register_00000014,x_data) <= *(ulong *)(this + 8) ||
      *(uint64_t *)(this + 0x10) != uVar1)) {
    return;
  }
  if (**(long **)(lVar2 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0;
  }
  else {
    AVar3 = (ArgMinMaxBase<duckdb::GreaterThan,false>)
            ((*(ulong *)(**(long **)(lVar2 + 8) + (*(ulong *)(lVar2 + 0x18) >> 6) * 8) >>
              (*(ulong *)(lVar2 + 0x18) & 0x3f) & 1) == 0);
    this[1] = AVar3;
    if ((bool)AVar3) goto LAB_00da997c;
  }
  *(int *)(this + 4) = (int)state;
LAB_00da997c:
  *(ulong *)(this + 8) = CONCAT44(in_register_00000014,x_data);
  *(uint64_t *)(this + 0x10) = uVar1;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}